

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnBrOnExn(SharedValidator *this,Location *loc,Var *depth,Var *event_var)

{
  Result RVar1;
  Result RVar2;
  char *pcVar3;
  int __c;
  Var *__s;
  EventType event_type;
  _Vector_base<wabt::Type,_std::allocator<wabt::Type>_> local_88;
  Var local_70;
  
  this->expr_loc_ = loc;
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Var::Var(&local_70,event_var);
  __s = &local_70;
  RVar1 = CheckEventIndex(this,&local_70,(EventType *)&local_88);
  Var::~Var(&local_70);
  pcVar3 = Var::index(depth,(char *)__s,__c);
  RVar2 = TypeChecker::OnBrOnExn(&this->typechecker_,(Index)pcVar3,(TypeVector *)&local_88);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base(&local_88);
  return (Result)(uint)(RVar2.enum_ == Error || RVar1.enum_ == Error);
}

Assistant:

Result SharedValidator::OnBrOnExn(const Location& loc,
                                  Var depth,
                                  Var event_var) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  EventType event_type;
  result |= CheckEventIndex(event_var, &event_type);
  result |= typechecker_.OnBrOnExn(depth.index(), event_type.params);
  return result;
}